

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_AlmostEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_AlmostEq_Test *this)

{
  int iVar1;
  int *in_R9;
  int x;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  iVar1 = 1;
  x = iVar1;
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar1;
  iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<int,int>
            (&iutest_ar,(CmpHelper *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x124,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = iVar1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar1;
    iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<int,int>
              (&iutest_ar,(CmpHelper *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x126,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = iVar1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar1;
    iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<int,int>
              (&iutest_ar,(CmpHelper *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
    if (iutest_ar.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0x128,iutest_ar.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = iVar1;
    local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = iVar1;
    iutest::internal::backward::AlmostEqHelper<false>::CmpHelper::Compare<int,int>
              (&iutest_ar,(CmpHelper *)0x31e18d,"x",(char *)&local_198,&x,in_R9);
    if (iutest_ar.m_result != false) goto LAB_002e1ec3;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x12a,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_002e1ec3:
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(SyntaxTest, AlmostEq)
{
    if( int x = 1 )
        IUTEST_ASSERT_ALMOST_EQ(1, x);
    if( int x = 1 )
        IUTEST_EXPECT_ALMOST_EQ(1, x);
    if( int x = 1 )
        IUTEST_INFORM_ALMOST_EQ(1, x);
    if( int x = 1 )
        IUTEST_ASSUME_ALMOST_EQ(1, x);
}